

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O1

IssuanceParameter * __thiscall
cfd::ConfidentialTransactionContext::SetAssetReissuance
          (IssuanceParameter *__return_storage_ptr__,ConfidentialTransactionContext *this,
          OutPoint *outpoint,Amount *amount,
          vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>
          *issue_output_list,BlindFactor *blind_factor,BlindFactor *entropy)

{
  ByteData *this_00;
  pointer pIVar1;
  pointer pIVar2;
  pointer puVar3;
  Script *pSVar4;
  undefined8 uVar5;
  bool bVar6;
  uint32_t tx_in_index;
  Script *this_01;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> asset_output_amount_list;
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
  asset_nonce_list;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> asset_locking_script_list;
  ConfidentialNonce nonce;
  ConfidentialKey local_380;
  undefined1 local_368 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358 [23];
  Script script;
  Address addr;
  
  asset_output_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  asset_output_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  asset_output_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  asset_locking_script_list.
  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  asset_locking_script_list.
  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  asset_locking_script_list.
  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  asset_nonce_list.
  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  asset_nonce_list.
  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  asset_nonce_list.
  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tx_in_index = (*(this->super_ConfidentialTransaction).super_AbstractTransaction.
                  _vptr_AbstractTransaction[0xf])(this,outpoint);
  pIVar1 = (issue_output_list->
           super__Vector_base<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (issue_output_list->
           super__Vector_base<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar1 != pIVar2) {
    this_01 = &pIVar1->direct_locking_script;
    do {
      core::ConfidentialNonce::ConfidentialNonce(&nonce);
      core::Script::Script(&script);
      bVar6 = core::Script::IsEmpty(this_01);
      if (bVar6) {
        core::Address::Address(&addr);
        this_00 = &this_01[-8].script_data_;
        core::ElementsConfidentialAddress::GetAddress_abi_cxx11_
                  ((string *)local_368,(ElementsConfidentialAddress *)this_00);
        uVar5 = local_368._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._0_8_ != local_358) {
          operator_delete((void *)local_368._0_8_,local_358[0]._M_allocated_capacity + 1);
        }
        if ((pointer)uVar5 == (pointer)0x0) {
          core::Address::operator=
                    (&addr,(Address *)
                           &this_01[-0xf].script_data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish);
        }
        else {
          core::ElementsConfidentialAddress::GetUnblindedAddress
                    ((Address *)local_368,(ElementsConfidentialAddress *)this_00);
          core::Address::operator=(&addr,(Address *)local_368);
          core::Address::~Address((Address *)local_368);
          if (*(char *)&this_01[1].script_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish == '\0') {
            core::ElementsConfidentialAddress::GetConfidentialKey
                      (&local_380,(ElementsConfidentialAddress *)this_00);
            core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_368,&local_380);
            core::ConfidentialNonce::operator=(&nonce,(ConfidentialNonce *)local_368);
            local_368._0_8_ = &PTR__ConfidentialNonce_0087cc78;
            if ((pointer)local_368._8_8_ != (pointer)0x0) {
              operator_delete((void *)local_368._8_8_,local_358[0]._8_8_ - local_368._8_8_);
            }
            if (local_380.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_380.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_380.data_.data_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_380.data_.data_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
        }
        core::Address::GetLockingScript((Script *)local_368,&addr);
        core::Script::operator=(&script,(Script *)local_368);
        core::Script::~Script((Script *)local_368);
        core::Address::~Address(&addr);
      }
      else {
        core::Script::operator=(&script,this_01);
      }
      if (asset_output_amount_list.
          super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          asset_output_amount_list.
          super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>::
        _M_realloc_insert<cfd::core::Amount_const&>
                  ((vector<cfd::core::Amount,std::allocator<cfd::core::Amount>> *)
                   &asset_output_amount_list,
                   (iterator)
                   asset_output_amount_list.
                   super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl
                   .super__Vector_impl_data._M_finish,(Amount *)(this_01 + 1));
      }
      else {
        puVar3 = this_01[1].script_data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (asset_output_amount_list.
         super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
         super__Vector_impl_data._M_finish)->amount_ = (int64_t)this_01[1]._vptr_Script;
        *(pointer *)
         &(asset_output_amount_list.
           super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
           super__Vector_impl_data._M_finish)->ignore_check_ = puVar3;
        asset_output_amount_list.
        super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
        super__Vector_impl_data._M_finish =
             asset_output_amount_list.
             super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
                (&asset_locking_script_list,&script);
      std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
      push_back(&asset_nonce_list,&nonce);
      core::Script::~Script(&script);
      nonce._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_0087cc78;
      if (nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(nonce.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)nonce.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)nonce.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pSVar4 = this_01 + 1;
      this_01 = (Script *)&this_01[0x10].script_data_;
    } while ((pointer)&(pSVar4->script_data_).data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage != pIVar2);
  }
  core::ConfidentialTransaction::SetAssetReissuance
            (__return_storage_ptr__,&this->super_ConfidentialTransaction,tx_in_index,amount,
             &asset_output_amount_list,&asset_locking_script_list,&asset_nonce_list,blind_factor,
             entropy);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::~vector
            (&asset_nonce_list);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector
            (&asset_locking_script_list);
  if (asset_output_amount_list.
      super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(asset_output_amount_list.
                    super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)asset_output_amount_list.
                          super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)asset_output_amount_list.
                          super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

IssuanceParameter ConfidentialTransactionContext::SetAssetReissuance(
    const OutPoint& outpoint, const Amount& amount,
    const std::vector<IssuanceOutputParameter>& issue_output_list,
    const BlindFactor& blind_factor, const BlindFactor& entropy) {
  std::vector<Amount> asset_output_amount_list;
  std::vector<Script> asset_locking_script_list;
  std::vector<ConfidentialNonce> asset_nonce_list;

  static auto set_func = [](const std::vector<IssuanceOutputParameter>& list,
                            std::vector<Amount>* amount_list,
                            std::vector<Script>* locking_script_list,
                            std::vector<ConfidentialNonce>* nonce_list) {
    for (const auto& data : list) {
      ConfidentialNonce nonce;
      Script script;
      if (!data.direct_locking_script.IsEmpty()) {
        script = data.direct_locking_script;
      } else {
        Address addr;
        if (data.confidential_address.GetAddress().empty()) {
          addr = data.address;
        } else {
          addr = data.confidential_address.GetUnblindedAddress();
          if (!data.is_remove_nonce) {
            nonce = ConfidentialNonce(
                data.confidential_address.GetConfidentialKey());
          }
        }
        script = addr.GetLockingScript();
      }
      amount_list->push_back(data.amount);
      locking_script_list->push_back(script);
      nonce_list->push_back(nonce);
    }
    return;
  };

  uint32_t txin_index = GetTxInIndex(outpoint);
  set_func(
      issue_output_list, &asset_output_amount_list, &asset_locking_script_list,
      &asset_nonce_list);

  return SetAssetReissuance(
      txin_index, amount, asset_output_amount_list, asset_locking_script_list,
      asset_nonce_list, blind_factor, entropy);
}